

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoofft.c
# Opt level: O1

CURLofft curlx_strtoofft(char *str,char **endp,int base,curl_off_t *num)

{
  char cVar1;
  CURLofft CVar2;
  int *piVar3;
  long lVar4;
  char *end;
  char *local_30;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  *num = 0;
  while( true ) {
    cVar1 = *str;
    if ((cVar1 != '\t') && (cVar1 != ' ')) break;
    str = str + 1;
  }
  if ((cVar1 == '-') || ((byte)(cVar1 - 10U) < 4)) {
    CVar2 = CURL_OFFT_INVAL;
    if (endp != (char **)0x0) {
      *endp = str;
    }
  }
  else {
    lVar4 = strtol(str,&local_30,base);
    if (endp != (char **)0x0) {
      *endp = local_30;
    }
    CVar2 = CURL_OFFT_FLOW;
    if (*piVar3 != 0x22) {
      if (str == local_30) {
        CVar2 = CURL_OFFT_INVAL;
      }
      else {
        *num = lVar4;
        CVar2 = CURL_OFFT_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLofft curlx_strtoofft(const char *str, char **endp, int base,
                         curl_off_t *num)
{
  char *end;
  curl_off_t number;
  errno = 0;
  *num = 0; /* clear by default */

  while(*str && ISBLANK(*str))
    str++;
  if(('-' == *str) || (ISSPACE(*str))) {
    if(endp)
      *endp = (char *)str; /* didn't actually move */
    return CURL_OFFT_INVAL; /* nothing parsed */
  }
  number = strtooff(str, &end, base);
  if(endp)
    *endp = end;
  if(errno == ERANGE)
    /* overflow/underflow */
    return CURL_OFFT_FLOW;
  else if(str == end)
    /* nothing parsed */
    return CURL_OFFT_INVAL;

  *num = number;
  return CURL_OFFT_OK;
}